

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall BaseSocketImpl::~BaseSocketImpl(BaseSocketImpl *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_BaseSocketImpl = (_func_int **)&PTR__BaseSocketImpl_00147318;
  if ((this->m_thListen)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->m_thWrite)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->m_thClose)._M_id._M_thread != 0) {
    std::thread::join();
  }
  p_Var1 = (this->m_fClosingParam).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fClosingParam,(_Any_data *)&this->m_fClosingParam,
              __destroy_functor);
  }
  p_Var1 = (this->m_fClosing).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fClosing,(_Any_data *)&this->m_fClosing,__destroy_functor);
  }
  p_Var1 = (this->m_fErrorParam).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fErrorParam,(_Any_data *)&this->m_fErrorParam,__destroy_functor)
    ;
  }
  p_Var1 = (this->m_fError).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fError,(_Any_data *)&this->m_fError,__destroy_functor);
  }
  if ((((this->m_thClose)._M_id._M_thread == 0) && ((this->m_thWrite)._M_id._M_thread == 0)) &&
     ((this->m_thListen)._M_id._M_thread == 0)) {
    pcVar2 = (this->m_strName)._M_dataplus._M_p;
    paVar3 = &(this->m_strName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
      return;
    }
    return;
  }
  std::terminate();
}

Assistant:

BaseSocketImpl::~BaseSocketImpl()
{
    if (m_thListen.joinable() == true)
        m_thListen.join();
    if (m_thWrite.joinable() == true)
        m_thWrite.join();
    if (m_thClose.joinable() == true)
        m_thClose.join();
}